

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_dpb.c
# Opt level: O0

void unmark_for_reference(H264_DecCtx_t *p_Dec,H264_FrameStore_t *fs)

{
  H264_StorePic_t *cur_pic;
  H264_FrameStore_t *fs_local;
  H264_DecCtx_t *p_Dec_local;
  
  if (((fs->is_used & 1U) != 0) && (fs->top_field != (h264_store_pic_t *)0x0)) {
    fs->top_field->used_for_reference = 0;
  }
  if (((fs->is_used & 2U) != 0) && (fs->bottom_field != (h264_store_pic_t *)0x0)) {
    fs->bottom_field->used_for_reference = 0;
  }
  if (fs->is_used == 3) {
    if ((fs->top_field != (h264_store_pic_t *)0x0) && (fs->bottom_field != (h264_store_pic_t *)0x0))
    {
      fs->top_field->used_for_reference = 0;
      fs->bottom_field->used_for_reference = 0;
    }
    fs->frame->used_for_reference = 0;
  }
  fs->is_reference = 0;
  return;
}

Assistant:

static void unmark_for_reference(H264_DecCtx_t *p_Dec, H264_FrameStore_t* fs)
{
    H264_StorePic_t *cur_pic = NULL;
    if (fs->is_used & 1) {
        if (fs->top_field) {
            fs->top_field->used_for_reference = 0;
            cur_pic = fs->top_field;
        }
    }
    if (fs->is_used & 2) {
        if (fs->bottom_field) {
            fs->bottom_field->used_for_reference = 0;
            cur_pic = fs->bottom_field;
        }
    }
    if (fs->is_used == 3) {
        if (fs->top_field && fs->bottom_field) {
            fs->top_field->used_for_reference = 0;
            fs->bottom_field->used_for_reference = 0;
        }
        fs->frame->used_for_reference = 0;
        cur_pic = fs->frame;
    }
    fs->is_reference = 0;
    (void)cur_pic;
    (void)p_Dec;
}